

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<int,kj::String>::Callbacks>::
insert<kj::HashMap<int,kj::String>::Entry,int&>
          (HashIndex<kj::HashMap<int,kj::String>::Callbacks> *this,
          ArrayPtr<kj::HashMap<int,_kj::String>::Entry> table,size_t pos,int *params)

{
  uint uVar1;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  uint uVar3;
  HashIndex<kj::HashMap<int,_kj::String>::Callbacks> *this_00;
  uint *puVar4;
  uint uVar5;
  unsigned_long uVar6;
  int *in_R9;
  uint *puVar7;
  Maybe<unsigned_long> MVar8;
  
  this_00 = (HashIndex<kj::HashMap<int,_kj::String>::Callbacks> *)table.ptr;
  if ((ulong)(*(long *)(this_00 + 0x18) * 2) < (*(long *)(this_00 + 8) + pos) * 3 + 3) {
    HashIndex<kj::HashMap<int,_kj::String>::Callbacks>::rehash(this_00,pos * 3 + 3);
  }
  uVar3 = hashCode<int&>(in_R9);
  aVar2 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
          ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(this_00 + 0x18))->value;
  uVar5 = (int)aVar2.value - 1U & uVar3;
  puVar4 = (uint *)0x0;
  do {
    puVar7 = (uint *)(*(long *)(this_00 + 0x10) + (ulong)uVar5 * 8);
    uVar1 = puVar7[1];
    if (uVar1 == 1) {
      if (puVar4 == (uint *)0x0) {
        puVar4 = puVar7;
      }
    }
    else {
      if (uVar1 == 0) {
        if (puVar4 != (uint *)0x0) {
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + -1;
          puVar7 = puVar4;
        }
        *(ulong *)puVar7 = ((ulong)uVar3 | (long)params << 0x20) + 0x200000000;
        *this = (HashIndex<kj::HashMap<int,kj::String>::Callbacks>)0x0;
        goto LAB_0016eeba;
      }
      if ((*puVar7 == uVar3) && (*(int *)(table.size_ + (ulong)(uVar1 - 2) * 0x20) == *in_R9)) {
        *this = (HashIndex<kj::HashMap<int,kj::String>::Callbacks>)0x1;
        *(ulong *)(this + 8) = (ulong)(uVar1 - 2);
LAB_0016eeba:
        MVar8.ptr.field_1.value = aVar2.value;
        MVar8.ptr._0_8_ = this;
        return (Maybe<unsigned_long>)MVar8.ptr;
      }
    }
    uVar6 = (ulong)uVar5 + 1;
    uVar5 = (uint)uVar6;
    if (uVar6 == aVar2.value) {
      uVar5 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }